

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_Alloc.cpp
# Opt level: O0

void * crnlib::MyAlloc(size_t size)

{
  long in_RDI;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = crnlib_malloc(0x235c36);
  }
  return local_8;
}

Assistant:

void* MyAlloc(size_t size) {
  if (size == 0)
    return 0;
#ifdef _SZ_ALLOC_DEBUG
  {
    void* p = crnlib::crnlib_malloc(size);
    fprintf(stderr, "\nAlloc %10d bytes, count = %10d,  addr = %8X", size, g_allocCount++, (unsigned)p);
    return p;
  }
#else
  return crnlib::crnlib_malloc(size);
#endif
}